

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external.cpp
# Opt level: O0

void __thiscall CaDiCaL::External::remove_observed_var(External *this,int elit)

{
  bool bVar1;
  reference pvVar2;
  int in_ESI;
  long in_RDI;
  reference rVar3;
  int ilit;
  int eidx;
  _Bit_reference in_stack_ffffffffffffffc8;
  undefined1 auVar4 [12];
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  value_type vVar5;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffe0;
  vector<bool,_std::allocator<bool>_> *this_00;
  
  auVar4 = in_stack_ffffffffffffffc8._4_12_;
  if (*(long *)(in_RDI + 0x180) != 0) {
    if (in_ESI < 1) {
      in_ESI = -in_ESI;
    }
    if (in_ESI <= *(int *)(in_RDI + 8)) {
      rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_ffffffffffffffe0,
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      this_00 = (vector<bool,_std::allocator<bool>_> *)rVar3._M_p;
      bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&stack0xffffffffffffffe0)
      ;
      if (bVar1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)in_ESI);
        vVar5 = *pvVar2;
        Internal::remove_observed_var(auVar4._4_8_,auVar4._0_4_);
        rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (this_00,CONCAT44(vVar5,in_stack_ffffffffffffffd8));
        std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffc8,false);
        melt((External *)rVar3._M_mask,rVar3._M_p._4_4_);
      }
    }
  }
  return;
}

Assistant:

void External::remove_observed_var (int elit) {
  if (!propagator) {
    LOG ("No connected propagator that could have watched the variable");
    return;
  }
  int eidx = abs (elit);

  if (eidx > max_var)
    return;

  if (is_observed[eidx]) {
    // Follow opposite order of add_observed_var, first remove internal
    // is_observed
    int ilit = e2i[eidx]; // internalize (elit);
    internal->remove_observed_var (ilit);

    is_observed[eidx] = false;
    melt (elit);
    LOG ("unmarking %d as externally watched", eidx);
  }
}